

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Morse.cpp
# Opt level: O0

RealType __thiscall
OpenMD::Morse::getSuggestedCutoffRadius
          (Morse *this,pair<OpenMD::AtomType_*,_OpenMD::AtomType_*> atypes)

{
  int iVar1;
  int iVar2;
  reference pvVar3;
  reference this_00;
  reference pvVar4;
  AtomType *in_RDX;
  AtomType *in_RSI;
  long in_RDI;
  RealType beta;
  RealType Re;
  MorseInteractionData mixer;
  int mtid2;
  int mtid1;
  int atid2;
  int atid1;
  Morse *in_stack_00000170;
  double local_8;
  
  if ((*(byte *)(in_RDI + 8) & 1) == 0) {
    initialize(in_stack_00000170);
  }
  iVar1 = AtomType::getIdent(in_RSI);
  iVar2 = AtomType::getIdent(in_RDX);
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x40),(long)iVar1);
  iVar1 = *pvVar3;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x40),(long)iVar2);
  iVar2 = *pvVar3;
  if ((iVar1 == -1) || (iVar2 == -1)) {
    local_8 = 0.0;
  }
  else {
    this_00 = std::
              vector<std::vector<OpenMD::MorseInteractionData,_std::allocator<OpenMD::MorseInteractionData>_>,_std::allocator<std::vector<OpenMD::MorseInteractionData,_std::allocator<OpenMD::MorseInteractionData>_>_>_>
              ::operator[]((vector<std::vector<OpenMD::MorseInteractionData,_std::allocator<OpenMD::MorseInteractionData>_>,_std::allocator<std::vector<OpenMD::MorseInteractionData,_std::allocator<OpenMD::MorseInteractionData>_>_>_>
                            *)(in_RDI + 0x58),(long)iVar1);
    pvVar4 = std::
             vector<OpenMD::MorseInteractionData,_std::allocator<OpenMD::MorseInteractionData>_>::
             operator[](this_00,(long)iVar2);
    local_8 = (pvVar4->beta * pvVar4->Re + 4.9) / pvVar4->beta;
  }
  return local_8;
}

Assistant:

RealType Morse::getSuggestedCutoffRadius(pair<AtomType*, AtomType*> atypes) {
    if (!initialized_) initialize();

    int atid1 = atypes.first->getIdent();
    int atid2 = atypes.second->getIdent();
    int mtid1 = Mtids[atid1];
    int mtid2 = Mtids[atid2];

    if (mtid1 == -1 || mtid2 == -1)
      return 0.0;
    else {
      MorseInteractionData mixer = MixingMap[mtid1][mtid2];
      RealType Re                = mixer.Re;
      RealType beta              = mixer.beta;
      // This value of the r corresponds to an energy about 1.48% of
      // the energy at the bottom of the Morse well.  For comparison, the
      // Lennard-Jones function is about 1.63% of it's minimum value at
      // a distance of 2.5 sigma.
      return (4.9 + beta * Re) / beta;
    }
  }